

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcAsymmetricIShapeProfileDef::~IfcAsymmetricIShapeProfileDef
          (IfcAsymmetricIShapeProfileDef *this)

{
  ~IfcAsymmetricIShapeProfileDef
            ((IfcAsymmetricIShapeProfileDef *)
             &this[-1].super_IfcIShapeProfileDef.super_IfcParameterizedProfileDef.
              super_IfcProfileDef.field_0x60);
  return;
}

Assistant:

IfcAsymmetricIShapeProfileDef() : Object("IfcAsymmetricIShapeProfileDef") {}